

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-and-bound-solver.hpp
# Opt level: O1

void __thiscall baryonyx::itm::shared_subvector::check_index(shared_subvector *this,size_type i)

{
  if ((ulong)((long)(this->m_container).
                    super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(this->m_container).super__Vector_base<signed_char,_std::allocator<signed_char>_>
                   ._M_impl.super__Vector_impl_data._M_start) < (ulong)(this->m_element_size + i)) {
    check_index();
  }
  else if (i % this->m_element_size == 0) {
    return;
  }
  check_index();
}

Assistant:

void check_index([[maybe_unused]] size_type i) const noexcept
    {
        bx_assert(i + m_element_size <= m_container.size());
        bx_assert(i % m_element_size == 0);
    }